

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunnerTest.cpp
# Opt level: O1

void __thiscall
TEST_CommandLineTestRunner_realJunitOutputShouldBeCreatedAndWorkProperly_Test::
~TEST_CommandLineTestRunner_realJunitOutputShouldBeCreatedAndWorkProperly_Test
          (TEST_CommandLineTestRunner_realJunitOutputShouldBeCreatedAndWorkProperly_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupCommandLineTestRunner).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupCommandLineTestRunner_00348380;
  TestRegistry::~TestRegistry(&(this->super_TEST_GROUP_CppUTestGroupCommandLineTestRunner).registry)
  ;
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x58);
  return;
}

Assistant:

TEST(CommandLineTestRunner, realJunitOutputShouldBeCreatedAndWorkProperly)
{
    const char* argv[] = { "tests.exe", "-ojunit", "-v", "-kpackage", };

    FakeOutput fakeOutput; /* UT_PTR_SET() is not reentrant */

    CommandLineTestRunner commandLineTestRunner(4, argv, &registry);
    commandLineTestRunner.runAllTestsMain();

    fakeOutput.restoreOriginals();

    STRCMP_CONTAINS("<testcase classname=\"package.group1\" name=\"test1\"", fakeOutput.file.asCharString());
    STRCMP_CONTAINS("TEST(group1, test1)", fakeOutput.console.asCharString());

}